

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O1

void __thiscall
CoreTest_FormatForeignStrings_Test::TestBody(CoreTest_FormatForeignStrings_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  basic_string_view<char> format_str;
  basic_string_view<wchar_t> format_str_00;
  basic_string_view<wchar_t> format_str_01;
  bool bVar2;
  char *message;
  _func_int **pp_Var3;
  basic_string_view<wchar_t> format_str_02;
  basic_string_view<wchar_t> format_str_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_03;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  AssertHelper local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  undefined1 local_68 [32];
  AssertHelperData *local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_40;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_78.data_ = (AssertHelperData *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"{}","");
  format_str.size_ = (size_t)pbStack_70;
  format_str.data_ = (char *)local_78.data_;
  local_48 = (AssertHelperData *)&DAT_0000002a;
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_48;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  fmt::v5::internal::vformat<char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             format_str,args);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&local_88,"fmt::format(my_string<char>(\"{}\"), 42)","\"42\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
             (char (*) [3])"42");
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_78.data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78.data_);
  }
  if (local_88._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = (local_80._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x238,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a8._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)local_68;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_78,L"{}",L"");
  format_str_00.size_ = (size_t)pbStack_70;
  format_str_00.data_ = (wchar_t *)local_78.data_;
  local_48 = (AssertHelperData *)&DAT_0000002a;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)&local_48;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
       ::TYPES;
  fmt::v5::internal::vformat<wchar_t>(&local_a8,format_str_00,args_00);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,wchar_t[3]>
            ((internal *)&local_88,"fmt::format(my_string<wchar_t>(L\"{}\"), 42)","L\"42\"",
             &local_a8,(wchar_t (*) [3])L"42");
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_78.data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78.data_);
  }
  if (local_88._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = (local_80._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x239,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a8._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)0x19b640;
  local_88 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>,wchar_t_const*&>
            (&local_80,&local_88,
             (allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)&local_38,(wchar_t **)&local_78);
  format_str_02.size_ = (size_t)(int)local_88->_M_string_length;
  local_78.data_ = (AssertHelperData *)&DAT_0000002a;
  format_str_02.data_ = (local_88->_M_dataplus)._M_p;
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)&local_78;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
       ::TYPES;
  fmt::v5::internal::vformat<wchar_t>(&local_a8,format_str_02,args_01);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,wchar_t[3]>
            ((internal *)&local_48,"fmt::format(QString(L\"{}\"), 42)","L\"42\"",&local_a8,
             (wchar_t (*) [3])L"42");
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if (local_48._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (sStack_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((sStack_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x23a,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a8._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)0x19b640;
  local_38 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>,wchar_t_const*&>
            (&local_30,&local_38,
             (allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)&local_48,(wchar_t **)&local_78);
  local_78.data_ = (AssertHelperData *)local_68;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_78,L"42",L"");
  format_str_03.size_ = (size_t)(int)local_38->_M_string_length;
  local_48 = local_78.data_;
  sStack_40.ptr_ = pbStack_70;
  format_str_03.data_ = (local_38->_M_dataplus)._M_p;
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)&local_48;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,my_ns::my_string<wchar_t>>
       ::TYPES;
  fmt::v5::internal::vformat<wchar_t>(&local_a8,format_str_03,args_02);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,wchar_t[3]>
            ((internal *)&local_88,"fmt::format(QString(L\"{}\"), my_string<wchar_t>(L\"42\"))",
             "L\"42\"",&local_a8,(wchar_t (*) [3])L"42");
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_78.data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78.data_);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if (local_88._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = (local_80._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x23b,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a8._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.data_ = (AssertHelperData *)local_68;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_78,L"{}",L"");
  local_48 = (AssertHelperData *)0x19b634;
  local_38 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>,wchar_t_const*&>
            (&local_30,&local_38,
             (allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)(local_68 + 0x1f),(wchar_t **)&local_48);
  format_str_01.size_ = (size_t)pbStack_70;
  format_str_01.data_ = (wchar_t *)local_78.data_;
  local_48 = (AssertHelperData *)(local_38->_M_dataplus)._M_p;
  sStack_40.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (long)(int)local_38->_M_string_length;
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)&local_48;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,FakeQt::QString>
       ::TYPES;
  fmt::v5::internal::vformat<wchar_t>(&local_a8,format_str_01,args_03);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,wchar_t[3]>
            ((internal *)&local_88,"fmt::format(my_string<wchar_t>(L\"{}\"), QString(L\"42\"))",
             "L\"42\"",&local_a8,(wchar_t (*) [3])L"42");
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if (local_78.data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78.data_);
  }
  if (local_88._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var3 = (_func_int **)0x1a26ec;
    }
    else {
      pp_Var3 = (local_80._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x23c,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_a8._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(BufferTest, AppendAllocatesEnoughStorage) {
  char data[19];
  mock_buffer<char> buffer(data, 10);
  const char *test = "abcdefgh";
  buffer.resize(10);
  EXPECT_CALL(buffer, do_grow(19));
  buffer.append(test, test + 9);
}